

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

MethodPrototypeSymbol * __thiscall
slang::ast::MethodPrototypeSymbol::createForModport
          (MethodPrototypeSymbol *this,Scope *scope,SyntaxNode *syntax,Token nameToken,bool isExport
          )

{
  BumpAllocator *args;
  MethodPrototypeSymbol *pMVar1;
  SubroutineSymbol *pSVar2;
  Diagnostic *pDVar3;
  char *pcVar4;
  SourceRange SVar5;
  string_view arg;
  MethodFlags flags;
  string_view name;
  MethodFlags local_62;
  string_view local_60;
  Visibility local_50;
  SubroutineKind local_4c;
  SourceLocation local_48;
  SyntaxNode *local_40;
  Info *local_38;
  
  local_38 = nameToken._0_8_;
  args = *(BumpAllocator **)&this->super_Symbol;
  local_62 = (short)((int)nameToken.info << 5) + ModportImport;
  local_40 = syntax;
  local_60 = parsing::Token::valueText((Token *)&local_40);
  local_48 = parsing::Token::location((Token *)&local_40);
  local_4c = Function;
  local_50 = Public;
  pMVar1 = BumpAllocator::
           emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::SubroutineKind,slang::ast::Visibility,slang::ast::MethodFlags&>
                     (args,(Compilation *)args,&local_60,&local_48,&local_4c,&local_50,&local_62);
  (pMVar1->super_Symbol).originatingSyntax = (SyntaxNode *)scope;
  pSVar2 = (SubroutineSymbol *)Scope::find((Scope *)this,local_60);
  if (pSVar2 == (SubroutineSymbol *)0x0) {
    if (local_60._M_len != 0) {
      SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)scope);
      pDVar3 = Scope::addDiag((Scope *)this,(DiagCode)0xe000a,SVar5);
      pcVar4 = "import";
      if ((char)nameToken.info != '\0') {
        pcVar4 = "export";
      }
      arg._M_str = pcVar4;
      arg._M_len = 6;
      Diagnostic::operator<<(pDVar3,arg);
      Diagnostic::operator<<(pDVar3,local_60);
    }
  }
  else {
    if ((pSVar2->super_Symbol).kind == Subroutine) {
      (pMVar1->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload.
      _M_value = pSVar2;
      (pMVar1->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged =
           true;
      return pMVar1;
    }
    SVar5 = parsing::Token::range((Token *)&local_40);
    pDVar3 = Scope::addDiag((Scope *)this,(DiagCode)0x23000a,SVar5);
    Diagnostic::operator<<(pDVar3,(pSVar2->super_Symbol).name);
    Diagnostic::addNote(pDVar3,(DiagCode)0x50001,(pSVar2->super_Symbol).location);
  }
  if ((pMVar1->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged ==
      false) {
    (pMVar1->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged = true;
  }
  (pMVar1->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value
       = (SubroutineSymbol *)0x0;
  (pMVar1->declaredReturnType).type = (Type *)args[0x19].head;
  return pMVar1;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::createForModport(const Scope& scope,
                                                               const SyntaxNode& syntax,
                                                               Token nameToken, bool isExport) {
    // Create the prototype symbol.
    auto& comp = scope.getCompilation();
    auto flags = isExport ? MethodFlags::ModportExport : MethodFlags::ModportImport;
    auto name = nameToken.valueText();
    auto result = comp.emplace<MethodPrototypeSymbol>(comp, name, nameToken.location(),
                                                      SubroutineKind::Function, Visibility::Public,
                                                      flags);
    result->setSyntax(syntax);

    // Find the target method we're importing or exporting from the parent interface.
    auto target = scope.find(name);
    if (!target) {
        if (!name.empty()) {
            auto& diag = scope.addDiag(diag::IfaceImportExportTarget, syntax.sourceRange());
            diag << (isExport ? "export"sv : "import"sv);
            diag << name;
        }

        result->subroutine = nullptr;
        result->declaredReturnType.setType(comp.getErrorType());
        return *result;
    }

    if (target->kind == SymbolKind::Subroutine) {
        result->subroutine = &target->as<SubroutineSymbol>();
    }
    else {
        auto& diag = scope.addDiag(diag::NotASubroutine, nameToken.range());
        diag << target->name;
        diag.addNote(diag::NoteDeclarationHere, target->location);

        result->subroutine = nullptr;
        result->declaredReturnType.setType(comp.getErrorType());
    }

    return *result;
}